

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O0

void * tmalloc_small(mstate m,size_t nb)

{
  malloc_tree_chunk *pmVar1;
  malloc_tree_chunk *pmVar2;
  mchunkptr pmVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  mchunkptr pmVar7;
  malloc_chunk *pmVar8;
  byte bVar9;
  bool bVar10;
  malloc_tree_chunk *local_c0;
  malloc_chunk *local_b8;
  mchunkptr F_1;
  mchunkptr B;
  bindex_t I;
  mchunkptr DV;
  size_t DVS;
  tchunkptr C1;
  tchunkptr C0;
  tbinptr *H;
  tchunkptr *CP;
  tchunkptr *RP;
  tchunkptr F;
  tchunkptr R;
  tchunkptr XP;
  mchunkptr r;
  size_t trem;
  uint J;
  binmap_t leastbit;
  bindex_t i;
  size_t rsize;
  tchunkptr v;
  tchunkptr t;
  size_t nb_local;
  mstate m_local;
  
  uVar4 = 0;
  for (uVar5 = m->treemap & -m->treemap; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x80000000) {
    uVar4 = uVar4 + 1;
  }
  rsize = (size_t)m->treebins[uVar4];
  _leastbit = (((tbinptr)rsize)->head & 0xfffffffffffffff8) - nb;
  v = (tchunkptr)rsize;
  while( true ) {
    if (v->child[0] == (malloc_tree_chunk *)0x0) {
      local_c0 = v->child[1];
    }
    else {
      local_c0 = v->child[0];
    }
    v = local_c0;
    if (local_c0 == (malloc_tree_chunk *)0x0) break;
    uVar6 = (local_c0->head & 0xfffffffffffffff8) - nb;
    if (uVar6 < _leastbit) {
      rsize = (size_t)local_c0;
      _leastbit = uVar6;
    }
  }
  if ((rsize < m->least_addr) || (pmVar7 = (mchunkptr)(rsize + nb), pmVar7 <= rsize)) {
    abort();
  }
  pmVar1 = *(malloc_tree_chunk **)(rsize + 0x30);
  if (*(size_t *)(rsize + 0x18) == rsize) {
    CP = (tchunkptr *)(rsize + 0x28);
    F = *(tchunkptr *)(rsize + 0x28);
    if (F == (tchunkptr)0x0) {
      CP = (tchunkptr *)(rsize + 0x20);
      F = *(tchunkptr *)(rsize + 0x20);
      if (F == (tchunkptr)0x0) goto LAB_00107cf6;
    }
    while( true ) {
      H = F->child + 1;
      bVar10 = true;
      if (F->child[1] == (malloc_tree_chunk *)0x0) {
        H = F->child;
        bVar10 = F->child[0] != (malloc_tree_chunk *)0x0;
      }
      if (!bVar10) break;
      CP = H;
      F = *H;
    }
    if (CP < m->least_addr) {
      abort();
    }
    *CP = (tchunkptr)0x0;
  }
  else {
    pmVar2 = *(malloc_tree_chunk **)(rsize + 0x10);
    F = *(tchunkptr *)(rsize + 0x18);
    bVar10 = false;
    if (((malloc_tree_chunk *)m->least_addr <= pmVar2) &&
       (bVar10 = false, pmVar2->bk == (malloc_tree_chunk *)rsize)) {
      bVar10 = F->fd == (malloc_tree_chunk *)rsize;
    }
    if (!bVar10) {
      abort();
    }
    pmVar2->bk = F;
    F->fd = pmVar2;
  }
LAB_00107cf6:
  if (pmVar1 != (malloc_tree_chunk *)0x0) {
    if ((tbinptr)rsize == m->treebins[*(uint *)(rsize + 0x38)]) {
      m->treebins[*(uint *)(rsize + 0x38)] = F;
      if (F == (tchunkptr)0x0) {
        m->treemap = (1 << ((byte)*(undefined4 *)(rsize + 0x38) & 0x1f) ^ 0xffffffffU) & m->treemap;
      }
    }
    else {
      if (pmVar1 < (malloc_tree_chunk *)m->least_addr) {
        abort();
      }
      if (pmVar1->child[0] == (malloc_tree_chunk *)rsize) {
        pmVar1->child[0] = F;
      }
      else {
        pmVar1->child[1] = F;
      }
    }
    if (F != (tchunkptr)0x0) {
      if (F < (tchunkptr)m->least_addr) {
        abort();
      }
      F->parent = pmVar1;
      pmVar1 = *(malloc_tree_chunk **)(rsize + 0x20);
      if (pmVar1 != (malloc_tree_chunk *)0x0) {
        if (pmVar1 < (malloc_tree_chunk *)m->least_addr) {
          abort();
        }
        F->child[0] = pmVar1;
        pmVar1->parent = F;
      }
      pmVar1 = *(malloc_tree_chunk **)(rsize + 0x28);
      if (pmVar1 != (malloc_tree_chunk *)0x0) {
        if (pmVar1 < (malloc_tree_chunk *)m->least_addr) {
          abort();
        }
        F->child[1] = pmVar1;
        pmVar1->parent = F;
      }
    }
  }
  if (_leastbit < 0x20) {
    *(ulong *)(rsize + 8) = _leastbit + nb | 3;
    *(ulong *)(rsize + 8 + _leastbit + nb) = *(ulong *)(rsize + 8 + _leastbit + nb) | 1;
  }
  else {
    *(size_t *)(rsize + 8) = nb | 3;
    pmVar7->head = _leastbit | 1;
    *(ulong *)((long)&pmVar7->prev_foot + _leastbit) = _leastbit;
    if (m->dvsize != 0) {
      pmVar3 = m->dv;
      uVar6 = m->dvsize >> 3;
      pmVar8 = (malloc_chunk *)(m->smallbins + (uint)((int)uVar6 << 1));
      bVar9 = (byte)uVar6;
      if ((m->smallmap & 1 << (bVar9 & 0x1f)) == 0) {
        m->smallmap = 1 << (bVar9 & 0x1f) | m->smallmap;
        local_b8 = pmVar8;
      }
      else {
        if (pmVar8->fd < (malloc_chunk *)m->least_addr) {
          abort();
        }
        local_b8 = pmVar8->fd;
      }
      pmVar8->fd = pmVar3;
      local_b8->bk = pmVar3;
      pmVar3->fd = local_b8;
      pmVar3->bk = pmVar8;
    }
    m->dvsize = _leastbit;
    m->dv = pmVar7;
  }
  return (void *)(rsize + 0x10);
}

Assistant:

static void* tmalloc_small(mstate m, size_t nb) {
  tchunkptr t, v;
  size_t rsize;
  bindex_t i;
  binmap_t leastbit = least_bit(m->treemap);
  compute_bit2idx(leastbit, i);
  v = t = *treebin_at(m, i);
  rsize = chunksize(t) - nb;

  while ((t = leftmost_child(t)) != 0) {
    size_t trem = chunksize(t) - nb;
    if (trem < rsize) {
      rsize = trem;
      v = t;
    }
  }

  if (RTCHECK(ok_address(m, v))) {
    mchunkptr r = chunk_plus_offset(v, nb);
    assert(chunksize(v) == rsize + nb);
    if (RTCHECK(ok_next(v, r))) {
      unlink_large_chunk(m, v);
      if (rsize < MIN_CHUNK_SIZE)
        set_inuse_and_pinuse(m, v, (rsize + nb));
      else {
        set_size_and_pinuse_of_inuse_chunk(m, v, nb);
        set_size_and_pinuse_of_free_chunk(r, rsize);
        replace_dv(m, r, rsize);
      }
      return chunk2mem(v);
    }
  }

  CORRUPTION_ERROR_ACTION(m);
  return 0;
}